

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

void __thiscall
ON_RenderContentPrivate::ON_RenderContentPrivate
          (ON_RenderContentPrivate *this,ON_RenderContent *rc,wchar_t *kind)

{
  wchar_t *kind_local;
  ON_RenderContent *rc_local;
  ON_RenderContentPrivate *this_local;
  
  this->_vptr_ON_RenderContentPrivate = (_func_int **)&PTR__ON_RenderContentPrivate_00b77918;
  this->m_model = (ONX_Model *)0x0;
  ON_XMLNode::ON_XMLNode(&this->m_node,kind);
  this->m_render_content = rc;
  this->m_parent = (ON_RenderContent *)0x0;
  this->m_first_child = (ON_RenderContent *)0x0;
  this->m_next_sibling = (ON_RenderContent *)0x0;
  std::recursive_mutex::recursive_mutex(&this->m_mutex);
  return;
}

Assistant:

ON_RenderContentPrivate::ON_RenderContentPrivate(ON_RenderContent& rc, const wchar_t* kind)
  :
  m_node(kind),
  m_render_content(rc)
{
}